

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2cirs.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  double dVar2;
  CEDate date;
  CESkyCoord obs_coords;
  CESkyCoord cirs_coords;
  CEObserver observer;
  CEExecOptions opts;
  allocator local_3f6;
  allocator local_3f5;
  CESkyCoordType local_3f4;
  double local_3f0 [2];
  string local_3e0 [2];
  string local_3a0;
  double local_370 [2];
  string local_360;
  double local_330;
  undefined8 local_328;
  string local_320;
  CEObserver local_300 [32];
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  CEExecOptions local_250;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine(&local_250.super_CLOptions,argc,argv);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_3e0,"longitude",(allocator *)&local_330);
    local_320._M_dataplus._M_p = (pointer)CLOptions::AsDouble(&local_250.super_CLOptions,local_3e0);
    std::__cxx11::string::string((string *)&local_3a0,"latitude",(allocator *)&local_3f4);
    local_3f0[0] = CLOptions::AsDouble(&local_250.super_CLOptions,&local_3a0);
    std::__cxx11::string::string((string *)&local_360,"elevation",&local_3f6);
    local_370[0] = CLOptions::AsDouble(&local_250.super_CLOptions,&local_360);
    local_328 = (double)((ulong)local_328._4_4_ << 0x20);
    CEObserver::CEObserver
              (local_300,(double *)&local_320,local_3f0,local_370,(CEAngleType *)&local_328);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)local_3e0);
    std::__cxx11::string::string((string *)local_3e0,"pressure",(allocator *)&local_3a0);
    local_2e0 = CLOptions::AsDouble(&local_250.super_CLOptions,local_3e0);
    std::__cxx11::string::~string((string *)local_3e0);
    std::__cxx11::string::string((string *)local_3e0,"temperature",(allocator *)&local_3a0);
    local_2d8 = CLOptions::AsDouble(&local_250.super_CLOptions,local_3e0);
    std::__cxx11::string::~string((string *)local_3e0);
    std::__cxx11::string::string((string *)local_3e0,"humidity",(allocator *)&local_3a0);
    local_2d0 = CLOptions::AsDouble(&local_250.super_CLOptions,local_3e0);
    std::__cxx11::string::~string((string *)local_3e0);
    std::__cxx11::string::string((string *)local_3e0,"wavelength",(allocator *)&local_3a0);
    local_2c8 = CLOptions::AsDouble(&local_250.super_CLOptions,local_3e0);
    std::__cxx11::string::~string((string *)local_3e0);
    std::__cxx11::string::string((string *)&local_3a0,"juliandate",(allocator *)&local_360);
    dVar2 = CLOptions::AsDouble(&local_250.super_CLOptions,&local_3a0);
    CEDate::CEDate((CEDate *)local_3e0,dVar2,JD);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::string((string *)&local_360,"azimuth",&local_3f6);
    local_328 = CLOptions::AsDouble(&local_250.super_CLOptions,&local_360);
    CEAngle::Deg(local_3f0);
    std::__cxx11::string::string((string *)&local_320,"zenith",&local_3f5);
    local_330 = CLOptions::AsDouble(&local_250.super_CLOptions,&local_320);
    CEAngle::Deg(local_370);
    local_3f4 = OBSERVED;
    CESkyCoord::CESkyCoord
              ((CESkyCoord *)&local_3a0,(CEAngle *)local_3f0,(CEAngle *)local_370,&local_3f4);
    CEAngle::~CEAngle((CEAngle *)local_370);
    std::__cxx11::string::~string((string *)&local_320);
    CEAngle::~CEAngle((CEAngle *)local_3f0);
    std::__cxx11::string::~string((string *)&local_360);
    CESkyCoord::ConvertToCIRS((CEDate *)&local_360,(CEObserver *)&local_3a0);
    PrintResults(&local_250,(CESkyCoord *)&local_360);
    CESkyCoord::~CESkyCoord((CESkyCoord *)&local_360);
    CESkyCoord::~CESkyCoord((CESkyCoord *)&local_3a0);
    CEDate::~CEDate((CEDate *)local_3e0);
    CEObserver::~CEObserver(local_300);
  }
  CEExecOptions::~CEExecOptions(&local_250);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    
    // Parse the command line options
    CEExecOptions opts = DefineOpts() ;
    if (opts.ParseCommandLine(argc, argv)) return 0 ;

    // Define the observer
    CEObserver observer(opts.AsDouble("longitude"),
                        opts.AsDouble("latitude"),
                        opts.AsDouble("elevation"),
                        CEAngleType::DEGREES);
    observer.SetPressure_hPa(opts.AsDouble("pressure"));
    observer.SetTemperature_C(opts.AsDouble("temperature"));
    observer.SetRelativeHumidity(opts.AsDouble("humidity"));
    observer.SetWavelength_um(opts.AsDouble("wavelength"));

    // Define the date
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);

    // Convert the coordinates
    CESkyCoord obs_coords(CEAngle::Deg(opts.AsDouble("azimuth")),
                          CEAngle::Deg(opts.AsDouble("zenith")),
                          CESkyCoordType::OBSERVED);
    CESkyCoord cirs_coords = obs_coords.ConvertToCIRS(date, observer);
    
    // Print the results
    PrintResults(opts, cirs_coords) ;
    
    return 0;
}